

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O0

uint32_t __thiscall BufferedReader::getReaderCount(BufferedReader *this)

{
  size_type sVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  BufferedReader *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->m_readersMtx);
  sVar1 = std::
          map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
          ::size(&this->m_readers);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return (uint32_t)sVar1;
}

Assistant:

uint32_t BufferedReader::getReaderCount()
{
    std::lock_guard lock(m_readersMtx);
    return static_cast<uint32_t>(m_readers.size());
}